

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vtabCallConstructor(sqlite3 *db,Table *pTab,Module *pMod,
                       _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                       *xConstruct,char **pzErr)

{
  long lVar1;
  u8 *puVar2;
  char **ppcVar3;
  sqlite3_vtab *psVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  VtabCtx *pVVar9;
  VTable *pVTab;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  char *pcVar13;
  size_t sVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  char *zRight;
  Schema **ppSVar18;
  long lVar19;
  char *zErr;
  VtabCtx sCtx;
  uint local_78;
  char *local_58;
  VtabCtx local_50;
  
  ppcVar3 = pTab->azModuleArg;
  iVar8 = pTab->nModuleArg;
  local_58 = (char *)0x0;
  for (pVVar9 = db->pVtabCtx; pVVar9 != (VtabCtx *)0x0; pVVar9 = pVVar9->pPrior) {
    if (pVVar9->pTab == pTab) {
      pcVar11 = sqlite3MPrintf(db,"vtable constructor called recursively: %s",pTab->zName);
      *pzErr = pcVar11;
      return 6;
    }
  }
  pcVar11 = sqlite3MPrintf(db,"%s",pTab->zName);
  iVar6 = 7;
  if (pcVar11 != (char *)0x0) {
    pVTab = (VTable *)sqlite3DbMallocZero(db,0x30);
    iVar6 = 7;
    if (pVTab != (VTable *)0x0) {
      pVTab->db = db;
      pVTab->pMod = pMod;
      if (pTab->pSchema == (Schema *)0x0) {
        uVar12 = 0xfff0bdc0;
      }
      else {
        uVar7 = db->nDb;
        if ((int)uVar7 < 1) {
          uVar12 = 0;
        }
        else {
          ppSVar18 = &db->aDb->pSchema;
          uVar10 = 0;
          do {
            uVar12 = uVar10;
            if (*ppSVar18 == pTab->pSchema) break;
            uVar10 = uVar10 + 1;
            ppSVar18 = ppSVar18 + 4;
            uVar12 = (ulong)uVar7;
          } while (uVar7 != uVar10);
        }
      }
      pTab->azModuleArg[1] = db->aDb[(int)uVar12].zDbSName;
      local_50.pPrior = db->pVtabCtx;
      local_50.bDeclared = 0;
      db->pVtabCtx = &local_50;
      local_50.pVTable = pVTab;
      local_50.pTab = pTab;
      iVar6 = (*xConstruct)(db,pMod->pAux,iVar8,ppcVar3,&pVTab->pVtab,&local_58);
      db->pVtabCtx = local_50.pPrior;
      if (iVar6 == 0) {
        psVar4 = pVTab->pVtab;
        iVar6 = 0;
        if (psVar4 != (sqlite3_vtab *)0x0) {
          psVar4->pModule = (sqlite3_module *)0x0;
          *(undefined8 *)&psVar4->nRef = 0;
          psVar4->zErrMsg = (char *)0x0;
          pVTab->pVtab->pModule = pMod->pModule;
          pVTab->nRef = 1;
          if (local_50.bDeclared == 0) {
            pcVar13 = sqlite3MPrintf(db,"vtable constructor did not declare schema: %s",pTab->zName)
            ;
            *pzErr = pcVar13;
            sqlite3VtabUnlock(pVTab);
            iVar6 = 1;
          }
          else {
            pVTab->pNext = pTab->pVTable;
            pTab->pVTable = pVTab;
            if (0 < pTab->nCol) {
              lVar17 = 0;
              bVar5 = 0;
              do {
                pcVar13 = "";
                if ((pTab->aCol[lVar17].colFlags & 4) != 0) {
                  pcVar13 = pTab->aCol[lVar17].zName;
                  sVar14 = strlen(pcVar13);
                  pcVar13 = pcVar13 + sVar14 + 1;
                }
                sVar14 = strlen(pcVar13);
                uVar7 = (uint)sVar14;
                local_78 = uVar7 & 0x3fffffff;
                if ((sVar14 & 0x3fffffff) != 0) {
                  lVar19 = 0;
                  zRight = pcVar13;
LAB_00220b40:
                  iVar8 = sqlite3_strnicmp("hidden",zRight,6);
                  if ((iVar8 != 0) ||
                     (((lVar19 != 0 && (zRight[-1] != ' ')) || ((zRight[6] & 0xdfU) != 0))))
                  goto LAB_00220b6b;
                  uVar16 = 7 - (zRight[6] == 0);
                  if (uVar16 - (int)lVar19 <= local_78) {
                    lVar15 = -lVar19;
                    do {
                      pcVar13[lVar15] = pcVar13[lVar15 + (ulong)uVar16];
                      lVar1 = (ulong)uVar16 + lVar15;
                      lVar15 = lVar15 + 1;
                    } while (lVar1 + 1U <= (ulong)(uVar7 & 0x3fffffff));
                  }
                  if ((lVar19 != 0) && (*zRight == '\0')) {
                    zRight[-1] = '\0';
                  }
                  puVar2 = &pTab->aCol[lVar17].colFlags;
                  *puVar2 = *puVar2 | 2;
                  bVar5 = 0x80;
                  goto LAB_00220be3;
                }
LAB_00220b76:
                pTab->tabFlags = pTab->tabFlags | (uint)bVar5;
LAB_00220be3:
                lVar17 = lVar17 + 1;
              } while (lVar17 < pTab->nCol);
              iVar6 = 0;
            }
          }
        }
      }
      else {
        if (((iVar6 == 7) && (db->mallocFailed == '\0')) && (db->bBenignMalloc == '\0')) {
          db->mallocFailed = '\x01';
          if (0 < db->nVdbeExec) {
            (db->u1).isInterrupted = 1;
          }
          (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
        }
        if (local_58 == (char *)0x0) {
          pcVar13 = sqlite3MPrintf(db,"vtable constructor failed: %s",pcVar11);
          *pzErr = pcVar13;
        }
        else {
          pcVar13 = sqlite3MPrintf(db,"%s");
          *pzErr = pcVar13;
          sqlite3_free(local_58);
        }
        sqlite3DbFreeNN(db,pVTab);
      }
    }
    sqlite3DbFreeNN(db,pcVar11);
  }
  return iVar6;
LAB_00220b6b:
  lVar19 = lVar19 + -1;
  zRight = zRight + 1;
  if (-lVar19 == (ulong)(uVar7 & 0x3fffffff)) goto LAB_00220b76;
  goto LAB_00220b40;
}

Assistant:

static int vtabCallConstructor(
  sqlite3 *db, 
  Table *pTab,
  Module *pMod,
  int (*xConstruct)(sqlite3*,void*,int,const char*const*,sqlite3_vtab**,char**),
  char **pzErr
){
  VtabCtx sCtx;
  VTable *pVTable;
  int rc;
  const char *const*azArg = (const char *const*)pTab->azModuleArg;
  int nArg = pTab->nModuleArg;
  char *zErr = 0;
  char *zModuleName;
  int iDb;
  VtabCtx *pCtx;

  /* Check that the virtual-table is not already being initialized */
  for(pCtx=db->pVtabCtx; pCtx; pCtx=pCtx->pPrior){
    if( pCtx->pTab==pTab ){
      *pzErr = sqlite3MPrintf(db, 
          "vtable constructor called recursively: %s", pTab->zName
      );
      return SQLITE_LOCKED;
    }
  }

  zModuleName = sqlite3MPrintf(db, "%s", pTab->zName);
  if( !zModuleName ){
    return SQLITE_NOMEM_BKPT;
  }

  pVTable = sqlite3DbMallocZero(db, sizeof(VTable));
  if( !pVTable ){
    sqlite3DbFree(db, zModuleName);
    return SQLITE_NOMEM_BKPT;
  }
  pVTable->db = db;
  pVTable->pMod = pMod;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  pTab->azModuleArg[1] = db->aDb[iDb].zDbSName;

  /* Invoke the virtual table constructor */
  assert( &db->pVtabCtx );
  assert( xConstruct );
  sCtx.pTab = pTab;
  sCtx.pVTable = pVTable;
  sCtx.pPrior = db->pVtabCtx;
  sCtx.bDeclared = 0;
  db->pVtabCtx = &sCtx;
  rc = xConstruct(db, pMod->pAux, nArg, azArg, &pVTable->pVtab, &zErr);
  db->pVtabCtx = sCtx.pPrior;
  if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
  assert( sCtx.pTab==pTab );

  if( SQLITE_OK!=rc ){
    if( zErr==0 ){
      *pzErr = sqlite3MPrintf(db, "vtable constructor failed: %s", zModuleName);
    }else {
      *pzErr = sqlite3MPrintf(db, "%s", zErr);
      sqlite3_free(zErr);
    }
    sqlite3DbFree(db, pVTable);
  }else if( ALWAYS(pVTable->pVtab) ){
    /* Justification of ALWAYS():  A correct vtab constructor must allocate
    ** the sqlite3_vtab object if successful.  */
    memset(pVTable->pVtab, 0, sizeof(pVTable->pVtab[0]));
    pVTable->pVtab->pModule = pMod->pModule;
    pVTable->nRef = 1;
    if( sCtx.bDeclared==0 ){
      const char *zFormat = "vtable constructor did not declare schema: %s";
      *pzErr = sqlite3MPrintf(db, zFormat, pTab->zName);
      sqlite3VtabUnlock(pVTable);
      rc = SQLITE_ERROR;
    }else{
      int iCol;
      u8 oooHidden = 0;
      /* If everything went according to plan, link the new VTable structure
      ** into the linked list headed by pTab->pVTable. Then loop through the 
      ** columns of the table to see if any of them contain the token "hidden".
      ** If so, set the Column COLFLAG_HIDDEN flag and remove the token from
      ** the type string.  */
      pVTable->pNext = pTab->pVTable;
      pTab->pVTable = pVTable;

      for(iCol=0; iCol<pTab->nCol; iCol++){
        char *zType = sqlite3ColumnType(&pTab->aCol[iCol], "");
        int nType;
        int i = 0;
        nType = sqlite3Strlen30(zType);
        for(i=0; i<nType; i++){
          if( 0==sqlite3StrNICmp("hidden", &zType[i], 6)
           && (i==0 || zType[i-1]==' ')
           && (zType[i+6]=='\0' || zType[i+6]==' ')
          ){
            break;
          }
        }
        if( i<nType ){
          int j;
          int nDel = 6 + (zType[i+6] ? 1 : 0);
          for(j=i; (j+nDel)<=nType; j++){
            zType[j] = zType[j+nDel];
          }
          if( zType[i]=='\0' && i>0 ){
            assert(zType[i-1]==' ');
            zType[i-1] = '\0';
          }
          pTab->aCol[iCol].colFlags |= COLFLAG_HIDDEN;
          oooHidden = TF_OOOHidden;
        }else{
          pTab->tabFlags |= oooHidden;
        }
      }
    }
  }

  sqlite3DbFree(db, zModuleName);
  return rc;
}